

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

lyd_node * lyd_new_output_leaf(lyd_node *parent,lys_module *module,char *name,char *val_str)

{
  ly_ctx *ctx;
  LYS_NODE LVar1;
  int iVar2;
  lys_node *parent_00;
  size_t sVar3;
  lyd_node *plVar4;
  lys_module *plVar5;
  lys_node *node;
  lys_node **pplVar6;
  lys_node *local_38;
  lys_node *snode;
  
  local_38 = (lys_node *)0x0;
  if (parent == (lyd_node *)0x0 && module == (lys_module *)0x0 || name == (char *)0x0) {
LAB_00165678:
    plVar4 = (lyd_node *)0x0;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_new_output_leaf");
  }
  else {
    if (parent == (lyd_node *)0x0) {
      pplVar6 = &module->data;
LAB_0016560b:
      node = *pplVar6;
      if (node == (lys_node *)0x0) goto LAB_00165678;
    }
    else {
      if ((parent->schema == (lys_node *)0x0) ||
         (node = parent->schema->child, node == (lys_node *)0x0)) goto LAB_00165678;
      LVar1 = node->nodetype;
      if (LVar1 == LYS_INPUT) {
        node = node->next;
        if (node == (lys_node *)0x0) goto LAB_00165678;
        LVar1 = node->nodetype;
      }
      if (LVar1 == LYS_OUTPUT) {
        pplVar6 = &node->child;
        goto LAB_0016560b;
      }
    }
    parent_00 = lys_parent(node);
    sVar3 = strlen(name);
    iVar2 = lys_getnext_data(module,parent_00,name,(int)sVar3,LYS_LEAFLIST|LYS_LEAF,0,&local_38);
    if (iVar2 == 0 && local_38 != (lys_node *)0x0) {
      plVar4 = _lyd_new_leaf(parent,local_38,val_str,0,0);
    }
    else {
      ctx = node->module->ctx;
      plVar5 = lys_node_module(node);
      plVar4 = (lyd_node *)0x0;
      ly_log(ctx,LY_LLERR,LY_EINVAL,"Failed to find \"%s\" as a sibling to \"%s:%s\".",name,
             plVar5->name,node->name);
    }
  }
  return plVar4;
}

Assistant:

lyd_node *
lyd_new_output_leaf(struct lyd_node *parent, const struct lys_module *module, const char *name, const char *val_str)
{
    const struct lys_node *snode = NULL, *siblings;

    if ((!parent && !module) || !name) {
        LOGARG;
        return NULL;
    }

    siblings = lyd_new_find_schema(parent, module, 1);
    if (!siblings) {
        LOGARG;
        return NULL;
    }

    if (lys_getnext_data(module, lys_parent(siblings), name, strlen(name), LYS_LEAFLIST | LYS_LEAF, 0, &snode) || !snode) {
        LOGERR(siblings->module->ctx, LY_EINVAL, "Failed to find \"%s\" as a sibling to \"%s:%s\".",
               name, lys_node_module(siblings)->name, siblings->name);
        return NULL;
    }

    return _lyd_new_leaf(parent, snode, val_str, 0, 0);
}